

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O1

void luaF_initupvals(lua_State *L,LClosure *cl)

{
  UpVal *pUVar1;
  ulong uVar2;
  
  if (cl->nupvalues != '\0') {
    uVar2 = 0;
    do {
      pUVar1 = (UpVal *)luaM_realloc_(L,(void *)0x0,0,0x20);
      pUVar1->refcount = 1;
      pUVar1->v = (TValue *)&pUVar1->u;
      (pUVar1->u).open.touched = 0;
      cl->upvals[uVar2] = pUVar1;
      uVar2 = uVar2 + 1;
    } while (uVar2 < cl->nupvalues);
  }
  return;
}

Assistant:

void luaF_initupvals (lua_State *L, LClosure *cl) {
  int i;
  for (i = 0; i < cl->nupvalues; i++) {
    GCObject *o = luaC_newobj(L, LUA_VUPVAL, sizeof(UpVal));
    UpVal *uv = gco2upv(o);
    uv->v = &uv->u.value;  /* make it closed */
    setnilvalue(uv->v);
    cl->upvals[i] = uv;
    luaC_objbarrier(L, cl, o);
  }
}